

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigNumber.cpp
# Opt level: O3

BigNumber * operator+(BigNumber *__return_storage_ptr__,BigNumber *nb1,uint nb2)

{
  initializer_list<unsigned_int> __l;
  BigNumber tmp;
  allocator_type local_91;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_90;
  uint local_74;
  BigNumber local_70;
  BigNumber local_50;
  BigNumber local_30;
  
  __l._M_len = 1;
  __l._M_array = &local_74;
  local_74 = nb2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_90,__l,&local_91);
  BigNumber::BigNumber(&local_50,&local_90,nb1->m_base);
  if (local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_70,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)nb1);
  local_70.m_base = nb1->m_base;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_30,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_50);
  local_30.m_base = local_50.m_base;
  operator+(__return_storage_ptr__,&local_70,&local_30);
  if (local_30.super_Polynome.m_coef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.super_Polynome.m_coef.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_30.super_Polynome.m_coef.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.super_Polynome.m_coef.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_70.super_Polynome.m_coef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.super_Polynome.m_coef.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_70.super_Polynome.m_coef.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.super_Polynome.m_coef.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_50.super_Polynome.m_coef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.super_Polynome.m_coef.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50.super_Polynome.m_coef.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super_Polynome.m_coef.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

BigNumber operator + (BigNumber nb1, unsigned int nb2) {
    BigNumber tmp({nb2}, nb1.m_base);
    return nb1 + tmp;
}